

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

char * fts5ExprPrint(Fts5Config *pConfig,Fts5ExprNode *pExpr)

{
  long lVar1;
  Fts5ExprTerm *pFVar2;
  uint uVar3;
  Fts5ExprNearset *pFVar4;
  Fts5ExprPhrase *pFVar5;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  size_t sVar9;
  void *p;
  char *pcVar10;
  Fts5ExprTerm *pFVar11;
  char *pcVar12;
  char cVar13;
  long lVar14;
  char *pcVar15;
  long lVar16;
  long lVar17;
  char *pcVar18;
  u64 n;
  
  switch(pExpr->eType) {
  case 0:
    pcVar8 = sqlite3_mprintf("\"\"");
    return pcVar8;
  default:
    pcVar18 = " OR ";
    break;
  case 2:
    pcVar18 = " AND ";
    break;
  case 3:
    pcVar18 = " NOT ";
    break;
  case 4:
  case 9:
    pFVar4 = pExpr->pNear;
    if (pFVar4->pColset == (Fts5Colset *)0x0) {
      pcVar8 = (char *)0x0;
    }
    else {
      pcVar8 = fts5PrintfAppend((char *)0x0,"%s : ",pConfig->azCol[pFVar4->pColset->aiCol[0]]);
      if (pcVar8 == (char *)0x0) {
        return (char *)0x0;
      }
    }
    iVar6 = pFVar4->nPhrase;
    if (1 < iVar6) {
      pcVar8 = fts5PrintfAppend(pcVar8,"NEAR(");
      if (pcVar8 == (char *)0x0) {
        return (char *)0x0;
      }
      iVar6 = pFVar4->nPhrase;
    }
    if (iVar6 < 1) {
      return pcVar8;
    }
    lVar16 = 0;
    while( true ) {
      pFVar5 = pFVar4->apPhrase[lVar16];
      if ((lVar16 != 0) && (pcVar8 = fts5PrintfAppend(pcVar8," "), pcVar8 == (char *)0x0)) {
        return (char *)0x0;
      }
      if (0 < pFVar5->nTerm) break;
LAB_001d5dbc:
      lVar16 = lVar16 + 1;
      if (pFVar4->nPhrase <= lVar16) {
        if (1 < pFVar4->nPhrase) {
          pcVar8 = fts5PrintfAppend(pcVar8,", %d)",(ulong)(uint)pFVar4->nNear);
          return pcVar8;
        }
        return pcVar8;
      }
    }
    lVar17 = 0;
LAB_001d5ca1:
    pFVar2 = pFVar5->aTerm + lVar17;
    sVar9 = strlen(pFVar5->aTerm[lVar17].zTerm);
    n = 0;
    pFVar11 = pFVar2;
    do {
      n = n + (long)((int)sVar9 * 2 + 5);
      pFVar11 = pFVar11->pSynonym;
    } while (pFVar11 != (Fts5ExprTerm *)0x0);
    iVar6 = sqlite3_initialize();
    if ((iVar6 == 0) && (p = sqlite3Malloc(n), p != (void *)0x0)) {
      iVar6 = 0;
      pFVar11 = pFVar2;
LAB_001d5cf7:
      pcVar18 = pFVar11->zTerm;
      cVar13 = '\"';
      do {
        lVar14 = (long)iVar6;
        *(char *)((long)p + lVar14) = cVar13;
        lVar1 = lVar14 + 1;
        cVar13 = *pcVar18;
        if (cVar13 == '\"') {
          iVar6 = iVar6 + 2;
          *(undefined1 *)((long)p + lVar1) = 0x22;
          cVar13 = *pcVar18;
        }
        else {
          if (cVar13 == '\0') goto LAB_001d5d2c;
          iVar6 = (int)lVar1;
        }
        pcVar18 = pcVar18 + 1;
      } while( true );
    }
    goto LAB_001d5e03;
  }
  if (0 < pExpr->nChild) {
    lVar16 = 0;
    pcVar8 = (char *)0x0;
    while (pcVar7 = fts5ExprPrint(pConfig,pExpr->apChild[lVar16]), pcVar7 != (char *)0x0) {
      uVar3 = pExpr->apChild[lVar16]->eType;
      if (uVar3 < 10) {
        pcVar10 = "";
        pcVar15 = "";
        if ((0x211U >> (uVar3 & 0x1f) & 1) == 0) goto LAB_001d5bd5;
      }
      else {
LAB_001d5bd5:
        pcVar10 = "(";
        pcVar15 = ")";
      }
      pcVar12 = pcVar18;
      if (lVar16 == 0) {
        pcVar12 = "";
      }
      pcVar8 = fts5PrintfAppend(pcVar8,"%s%s%z%s",pcVar12,pcVar10,pcVar7,pcVar15);
      if (pcVar8 == (char *)0x0) {
        return (char *)0x0;
      }
      lVar16 = lVar16 + 1;
      if (pExpr->nChild <= lVar16) {
        return pcVar8;
      }
    }
LAB_001d5e03:
    sqlite3_free(pcVar8);
  }
  return (char *)0x0;
LAB_001d5d2c:
  *(undefined1 *)((long)p + lVar1) = 0x22;
  if (pFVar11->pSynonym == (Fts5ExprTerm *)0x0) {
    iVar6 = (int)(lVar14 + 2);
    goto LAB_001d5d53;
  }
  iVar6 = iVar6 + 3;
  *(undefined1 *)((long)p + lVar14 + 2) = 0x7c;
  pFVar11 = pFVar11->pSynonym;
  if (pFVar11 == (Fts5ExprTerm *)0x0) goto LAB_001d5d53;
  goto LAB_001d5cf7;
LAB_001d5d53:
  if (pFVar2->bPrefix != '\0') {
    *(undefined2 *)((long)p + (long)iVar6) = 0x2a20;
    iVar6 = iVar6 + 2;
  }
  *(undefined1 *)((long)p + (long)iVar6) = 0;
  pcVar18 = " + ";
  if (lVar17 == 0) {
    pcVar18 = "";
  }
  pcVar8 = fts5PrintfAppend(pcVar8,"%s%s",pcVar18,p);
  sqlite3_free(p);
  if (pcVar8 == (char *)0x0) {
    pcVar8 = (char *)0x0;
    goto LAB_001d5e03;
  }
  lVar17 = lVar17 + 1;
  if (pFVar5->nTerm <= lVar17) goto LAB_001d5dbc;
  goto LAB_001d5ca1;
}

Assistant:

static char *fts5ExprPrint(Fts5Config *pConfig, Fts5ExprNode *pExpr){
  char *zRet = 0;
  if( pExpr->eType==0 ){
    return sqlite3_mprintf("\"\"");
  }else
  if( pExpr->eType==FTS5_STRING || pExpr->eType==FTS5_TERM ){
    Fts5ExprNearset *pNear = pExpr->pNear;
    int i; 
    int iTerm;

    if( pNear->pColset ){
      int iCol = pNear->pColset->aiCol[0];
      zRet = fts5PrintfAppend(zRet, "%s : ", pConfig->azCol[iCol]);
      if( zRet==0 ) return 0;
    }

    if( pNear->nPhrase>1 ){
      zRet = fts5PrintfAppend(zRet, "NEAR(");
      if( zRet==0 ) return 0;
    }

    for(i=0; i<pNear->nPhrase; i++){
      Fts5ExprPhrase *pPhrase = pNear->apPhrase[i];
      if( i!=0 ){
        zRet = fts5PrintfAppend(zRet, " ");
        if( zRet==0 ) return 0;
      }
      for(iTerm=0; iTerm<pPhrase->nTerm; iTerm++){
        char *zTerm = fts5ExprTermPrint(&pPhrase->aTerm[iTerm]);
        if( zTerm ){
          zRet = fts5PrintfAppend(zRet, "%s%s", iTerm==0?"":" + ", zTerm);
          sqlite3_free(zTerm);
        }
        if( zTerm==0 || zRet==0 ){
          sqlite3_free(zRet);
          return 0;
        }
      }
    }

    if( pNear->nPhrase>1 ){
      zRet = fts5PrintfAppend(zRet, ", %d)", pNear->nNear);
      if( zRet==0 ) return 0;
    }

  }else{
    char const *zOp = 0;
    int i;

    switch( pExpr->eType ){
      case FTS5_AND: zOp = " AND "; break;
      case FTS5_NOT: zOp = " NOT "; break;
      default:  
        assert( pExpr->eType==FTS5_OR );
        zOp = " OR "; 
        break;
    }

    for(i=0; i<pExpr->nChild; i++){
      char *z = fts5ExprPrint(pConfig, pExpr->apChild[i]);
      if( z==0 ){
        sqlite3_free(zRet);
        zRet = 0;
      }else{
        int e = pExpr->apChild[i]->eType;
        int b = (e!=FTS5_STRING && e!=FTS5_TERM && e!=FTS5_EOF);
        zRet = fts5PrintfAppend(zRet, "%s%s%z%s", 
            (i==0 ? "" : zOp),
            (b?"(":""), z, (b?")":"")
        );
      }
      if( zRet==0 ) break;
    }
  }

  return zRet;
}